

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall slang::SmallVector<slang::syntax::TokenOrSyntax,_2UL>::SmallVector(void *param_1)

{
  size_type in_stack_ffffffffffffffd8;
  SmallVectorBase<slang::syntax::TokenOrSyntax> *in_stack_ffffffffffffffe0;
  
  SmallVectorBase<slang::syntax::TokenOrSyntax>::SmallVectorBase
            ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)param_1,2);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::reserve
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

explicit SmallVector(size_type capacity, UninitializedTag) : Base(N) {
        this->reserve(capacity);
    }